

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O0

wchar_t apply_filters(archive_read *a)

{
  wchar_t wVar1;
  rar5 *rar_00;
  void **ppvVar2;
  wchar_t ret;
  rar5 *rar;
  filter_info *flt;
  archive_read *a_local;
  
  flt = (filter_info *)a;
  rar_00 = get_context(a);
  *(byte *)&rar_00->cstate = *(byte *)&rar_00->cstate & 0xfd;
  ppvVar2 = cdeque_filter_p((filter_info **)&rar);
  wVar1 = cdeque_front(&(rar_00->cstate).filters,ppvVar2);
  if (((wVar1 == L'\0') && ((long)rar->qlist_offset < (rar_00->cstate).write_ptr)) &&
     ((long)(rar->qlist_offset + rar->rr_offset) <= (rar_00->cstate).write_ptr)) {
    if ((rar_00->cstate).last_write_ptr == rar->qlist_offset) {
      wVar1 = run_filter((archive_read *)flt,(filter_info *)rar);
      if (wVar1 != L'\0') {
        return wVar1;
      }
      ppvVar2 = cdeque_filter_p((filter_info **)&rar);
      cdeque_pop_front(&(rar_00->cstate).filters,ppvVar2);
      free(rar);
    }
    else {
      push_window_data((archive_read *)flt,rar_00,(rar_00->cstate).last_write_ptr,rar->qlist_offset)
      ;
    }
    a_local._4_4_ = L'\xfffffff6';
  }
  else {
    *(byte *)&rar_00->cstate = *(byte *)&rar_00->cstate & 0xfd | 2;
    a_local._4_4_ = L'\0';
  }
  return a_local._4_4_;
}

Assistant:

static int apply_filters(struct archive_read* a) {
	struct filter_info* flt;
	struct rar5* rar = get_context(a);
	int ret;

	rar->cstate.all_filters_applied = 0;

	/* Get the first filter that can be applied to our data. The data
	 * needs to be fully unpacked before the filter can be run. */
	if(CDE_OK == cdeque_front(&rar->cstate.filters,
	    cdeque_filter_p(&flt))) {
		/* Check if our unpacked data fully covers this filter's
		 * range. */
		if(rar->cstate.write_ptr > flt->block_start &&
		    rar->cstate.write_ptr >= flt->block_start +
		    flt->block_length) {
			/* Check if we have some data pending to be written
			 * right before the filter's start offset. */
			if(rar->cstate.last_write_ptr == flt->block_start) {
				/* Run the filter specified by descriptor
				 * `flt`. */
				ret = run_filter(a, flt);
				if(ret != ARCHIVE_OK) {
					/* Filter failure, return error. */
					return ret;
				}

				/* Filter descriptor won't be needed anymore
				 * after it's used, * so remove it from the
				 * filter list and free its memory. */
				(void) cdeque_pop_front(&rar->cstate.filters,
				    cdeque_filter_p(&flt));

				free(flt);
			} else {
				/* We can't run filters yet, dump the memory
				 * right before the filter. */
				push_window_data(a, rar,
				    rar->cstate.last_write_ptr,
				    flt->block_start);
			}

			/* Return 'filter applied or not needed' state to the
			 * caller. */
			return ARCHIVE_RETRY;
		}
	}

	rar->cstate.all_filters_applied = 1;
	return ARCHIVE_OK;
}